

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.h
# Opt level: O0

optional<unsigned_short> __thiscall
jbcoin::STObject::operator[]<jbcoin::STInteger<unsigned_short>>
          (STObject *this,OptionaledField<jbcoin::STInteger<unsigned_short>_> *of)

{
  int iVar1;
  SOE_Flags SVar2;
  STInteger<unsigned_short> *local_58;
  value_type_conflict6 local_3e;
  unsigned_short local_3c [2];
  STInteger<unsigned_short> *local_38;
  STInteger<unsigned_short> *u;
  STBase *local_28;
  STBase *b;
  OptionaledField<jbcoin::STInteger<unsigned_short>_> *of_local;
  STObject *this_local;
  
  b = (STBase *)of;
  of_local = (OptionaledField<jbcoin::STInteger<unsigned_short>_> *)this;
  local_28 = peekAtPField(this,&of->f->super_SField);
  if (local_28 == (STBase *)0x0) {
    boost::optional<unsigned_short>::optional((optional<unsigned_short> *)((long)&this_local + 4));
  }
  else {
    if (local_28 == (STBase *)0x0) {
      local_58 = (STInteger<unsigned_short> *)0x0;
    }
    else {
      local_58 = (STInteger<unsigned_short> *)
                 __dynamic_cast(local_28,&STBase::typeinfo,&STInteger<unsigned_short>::typeinfo,0);
    }
    local_38 = local_58;
    if (local_58 == (STInteger<unsigned_short> *)0x0) {
      if (this->mType == (SOTemplate *)0x0) {
        __assert_fail("mType",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/STObject.h"
                      ,0x393,
                      "boost::optional<std::decay_t<typename T::value_type>> jbcoin::STObject::operator[](const OptionaledField<T> &) const [T = jbcoin::STInteger<unsigned short>]"
                     );
      }
      iVar1 = (*local_28->_vptr_STBase[4])();
      if (iVar1 != 0) {
        __assert_fail("b->getSType() == STI_NOTPRESENT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/STObject.h"
                      ,0x394,
                      "boost::optional<std::decay_t<typename T::value_type>> jbcoin::STObject::operator[](const OptionaledField<T> &) const [T = jbcoin::STInteger<unsigned short>]"
                     );
      }
      SVar2 = SOTemplate::style(this->mType,(SField *)b->_vptr_STBase);
      if (SVar2 == SOE_OPTIONAL) {
        boost::optional<unsigned_short>::optional
                  ((optional<unsigned_short> *)((long)&this_local + 4));
      }
      else {
        SVar2 = SOTemplate::style(this->mType,(SField *)b->_vptr_STBase);
        if (SVar2 != SOE_DEFAULT) {
          __assert_fail("mType->style(*of.f) == SOE_DEFAULT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/STObject.h"
                        ,0x397,
                        "boost::optional<std::decay_t<typename T::value_type>> jbcoin::STObject::operator[](const OptionaledField<T> &) const [T = jbcoin::STInteger<unsigned short>]"
                       );
        }
        local_3c[0] = 0;
        boost::optional<unsigned_short>::optional
                  ((optional<unsigned_short> *)((long)&this_local + 4),local_3c);
      }
    }
    else {
      local_3e = STInteger<unsigned_short>::value(local_58);
      boost::optional<unsigned_short>::optional
                ((optional<unsigned_short> *)((long)&this_local + 4),&local_3e);
    }
  }
  return (optional<unsigned_short>)this_local._4_4_;
}

Assistant:

boost::optional<std::decay_t<typename T::value_type>>
STObject::operator[](OptionaledField<T> const& of) const
{
    auto const b = peekAtPField(*of.f);
    if (! b)
        return boost::none;
    auto const u =
        dynamic_cast<T const*>(b);
    if (! u)
    {
        assert(mType);
        assert(b->getSType() == STI_NOTPRESENT);
        if(mType->style(*of.f) == SOE_OPTIONAL)
            return boost::none;
        assert(mType->style(*of.f) == SOE_DEFAULT);
        return typename T::value_type{};
    }
    return u->value();
}